

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O3

void __thiscall
gmlc::networking::AsioContextManager::AsioContextManager
          (AsioContextManager *this,string *contextName)

{
  pointer pcVar1;
  io_context *this_00;
  
  (this->super_enable_shared_from_this<gmlc::networking::AsioContextManager>)._M_weak_this.
  super___weak_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<gmlc::networking::AsioContextManager>)._M_weak_this.
  super___weak_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_AsioContextManager = (_func_int **)&PTR__AsioContextManager_00569308;
  (this->runCounter).super___atomic_base<int>._M_i = 0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (contextName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + contextName->_M_string_length);
  this_00 = (io_context *)operator_new(0x10);
  ::asio::io_context::io_context((io_context *)this_00);
  (this->ictx)._M_t.super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>.
  _M_t.super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
  super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl = this_00;
  (this->nullwork)._M_t.
  super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>.
  super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl = (work *)0x0;
  this->leakOnDelete = false;
  (this->loopRet).super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->loopRet).super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&this->running = 0;
  *(undefined8 *)((long)&(this->runningLoopLock).super___mutex_base._M_mutex + 4) = 0;
  *(undefined8 *)((long)&(this->runningLoopLock).super___mutex_base._M_mutex + 0xc) = 0;
  *(undefined8 *)((long)&(this->runningLoopLock).super___mutex_base._M_mutex + 0x14) = 0;
  *(undefined8 *)
   ((long)&(this->runningLoopLock).super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)
   ((long)&(this->runningLoopLock).super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  return;
}

Assistant:

AsioContextManager::AsioContextManager(const std::string& contextName) :
    name(contextName), ictx(std::make_unique<asio::io_context>())
{
}